

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

void UCAFL::_uc_hook_block(uc_engine *uc,uint64_t address,uint32_t size,void *user_data)

{
  char *pcVar1;
  uint32_t uVar2;
  double __x;
  
  uVar2 = afl_hash_ip(address);
  pcVar1 = (char *)(*(long *)((long)user_data + 0x50) +
                   (*(ulong *)((long)user_data + 0x60) ^ (ulong)(uVar2 & 0xffff)));
  *pcVar1 = *pcVar1 + '\x01';
  *(ulong *)((long)user_data + 0x60) = (ulong)((uVar2 & 0xffff) >> 1);
  log(__x);
  return;
}

Assistant:

static void _uc_hook_block(uc_engine* uc, uint64_t address, uint32_t size,
                               void* user_data) {
        uint64_t cur_loc = afl_hash_ip(address) & (MAP_SIZE - 1);
        UCAFL* ucafl = (UCAFL*)user_data;

        ucafl->afl_area_ptr_[cur_loc ^ ucafl->afl_prev_loc_]++;
        ucafl->afl_prev_loc_ = cur_loc >> 1;

        ERR_CHILD("uc_hook_block address=0x%" PRIx64 " cur_loc=%" PRIu64
                  " prev_loc=%" PRIu64 "\n",
                  address, cur_loc, ucafl->afl_prev_loc_);
    }